

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setnativeclosurename(HSQUIRRELVM v,SQInteger idx,SQChar *name)

{
  SQNativeClosure *pSVar1;
  SQObjectPtr *pSVar2;
  SQString *x;
  SQRESULT SVar3;
  
  pSVar2 = stack_get(v,idx);
  if ((pSVar2->super_SQObject)._type == OT_NATIVECLOSURE) {
    pSVar1 = (pSVar2->super_SQObject)._unVal.pNativeClosure;
    x = SQString::Create(v->_sharedstate,name,-1);
    SQObjectPtr::operator=(&pSVar1->_name,x);
    SVar3 = 0;
  }
  else {
    sq_throwerror(v,"the object is not a nativeclosure");
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_setnativeclosurename(HSQUIRRELVM v,SQInteger idx,const SQChar *name)
{
    SQObject o = stack_get(v, idx);
    if(sq_isnativeclosure(o)) {
        SQNativeClosure *nc = _nativeclosure(o);
        nc->_name = SQString::Create(_ss(v),name);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a nativeclosure"));
}